

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuDevice.cpp
# Opt level: O0

void amrex::Gpu::Device::Initialize(void)

{
  int iVar1;
  string *prefix;
  int n_local_procs;
  int gpu_device_count;
  ParmParse pp;
  ParmParse ppamrex;
  int *in_stack_fffffffffffffec0;
  allocator *ref;
  string *in_stack_fffffffffffffec8;
  ParmParse *this;
  undefined4 local_124;
  int local_120;
  allocator local_119;
  string local_118 [120];
  int local_a0 [5];
  undefined1 local_89 [121];
  char *local_10;
  undefined4 *local_8;
  
  this = (ParmParse *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),"amrex",(allocator *)this);
  ParmParse::ParmParse(this,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  ParmParse::queryAdd<int,_0>(this,(char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  local_a0[0] = 8;
  prefix = (string *)std::min<int>(&max_gpu_streams,local_a0);
  max_gpu_streams = *(int *)prefix;
  ref = &local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"device",ref);
  ParmParse::ParmParse(this,prefix);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  ParmParse::queryAdd<int,_0>(this,(char *)prefix,(int *)ref);
  ParmParse::queryAdd<int,_0>(this,(char *)prefix,(int *)ref);
  Verbose();
  local_120 = 0;
  local_10 = "No GPU device found";
  Abort_host((char *)this);
  local_124 = 1;
  local_8 = &local_124;
  iVar1 = ParallelDescriptor::NProcs();
  if (iVar1 == 1) {
    device_id = 0;
  }
  else if (local_120 == 1) {
    device_id = 0;
  }
  initialize_gpu();
  profilerStart();
  ParmParse::~ParmParse((ParmParse *)0x12ed63b);
  ParmParse::~ParmParse((ParmParse *)0x12ed648);
  return;
}

Assistant:

void
Device::Initialize ()
{

#if defined(AMREX_USE_CUDA) && (defined(AMREX_PROFILING) || defined(AMREX_TINY_PROFILING))
    // Wrap cuda init to identify it appropriately in nvvp.
    // Note: first substantial cuda call may cause a lengthy
    // cuda API and cuda driver API initialization that will
    // be captured by the profiler. It a necessary, system
    // dependent step that is unavoidable.
    nvtxRangePush("initialize_device");
#endif

    ParmParse ppamrex("amrex");
    ppamrex.queryAdd("max_gpu_streams", max_gpu_streams);
    max_gpu_streams = std::min(max_gpu_streams, AMREX_GPU_MAX_STREAMS);

    ParmParse pp("device");

    pp.queryAdd("v", verbose);
    pp.queryAdd("verbose", verbose);

    if (amrex::Verbose()) {
        AMREX_HIP_OR_CUDA_OR_DPCPP
            ( amrex::Print() << "Initializing HIP...\n";,
              amrex::Print() << "Initializing CUDA...\n";,
              amrex::Print() << "Initializing oneAPI...\n"; )
    }

    // Count the number of GPU devices.
    int gpu_device_count = 0;
#ifdef AMREX_USE_DPCPP
    {
        sycl::gpu_selector device_selector;
        sycl::platform platform(device_selector);
        auto const& gpu_devices = platform.get_devices();
        gpu_device_count = gpu_devices.size();
        if (gpu_device_count <= 0) {
            amrex::Abort("No GPU device found");
        }
    }
#else
    AMREX_HIP_OR_CUDA(AMREX_HIP_SAFE_CALL (hipGetDeviceCount(&gpu_device_count));,
                      AMREX_CUDA_SAFE_CALL(cudaGetDeviceCount(&gpu_device_count)); );
    if (gpu_device_count <= 0) {
        amrex::Abort("No GPU device found");
    }
#endif

    // Now, assign ranks to GPUs. If we only have one GPU,
    // or only one MPI rank, this is easy. Otherwise, we
    // need to do a little more work.

    int n_local_procs = 1;
    amrex::ignore_unused(n_local_procs);

    if (ParallelDescriptor::NProcs() == 1) {
        device_id = 0;
    }
    else if (gpu_device_count == 1) {
        device_id = 0;
    }
    else {

        // ifdef the following against MPI so it compiles, but note
        // that we can only get here if using more than one processor,
        // which requires MPI.

#ifdef BL_USE_MPI

        // Create a communicator out of only the ranks sharing GPUs.
        // The default assumption is that this is all the ranks on the
        // same node, and to get that we'll use the MPI-3.0 split that
        // looks for shared memory communicators (and we'll error out
        // if that standard is unsupported).

#if MPI_VERSION < 3
        amrex::Abort("When using GPUs with MPI, if multiple devices are visible to each rank, MPI-3.0 must be supported.");
#endif

        // However, it's possible that the ranks sharing GPUs will be
        // confined to a single socket rather than a full node. Indeed,
        // this is often the optimal configuration; for example, on Summit,
        // a good configuration using jsrun is one resource set per
        // socket (two per node), with three GPUs per resource set.
        // To deal with this where we can, we'll take advantage of OpenMPI's
        // specialized split by socket. However, we only want to do this
        // if in fact our resource set is confined to the socket.
        // To make this determination we need to have system information,
        // which is provided by the build system for the systems
        // we know about. The simple heuristic we'll use to determine
        // this is if the number of visible devices is smaller than
        // the known number of GPUs per socket.

#if defined(AMREX_USE_CUDA)
#if (!defined(AMREX_GPUS_PER_SOCKET) && !defined(AMREX_GPUS_PER_NODE))
        amrex::Warning("Multiple GPUs are visible to each MPI rank, but the number of GPUs per socket or node has not been provided.\n"
                       "This may lead to incorrect or suboptimal rank-to-GPU mapping.");
#endif
#endif

        MPI_Comm local_comm;

        int split_type;

#if (defined(OPEN_MPI) && defined(AMREX_GPUS_PER_SOCKET))
        if (gpu_device_count <= AMREX_GPUS_PER_SOCKET)
            split_type = OMPI_COMM_TYPE_SOCKET;
        else
            split_type = OMPI_COMM_TYPE_NODE;
#else
        split_type = MPI_COMM_TYPE_SHARED;
#endif

        // We have no preference on how ranks get ordered within this communicator.
        int key = 0;

        MPI_Comm_split_type(ParallelDescriptor::Communicator(), split_type, key, MPI_INFO_NULL, &local_comm);

        // Get rank within the local communicator, and number of ranks.
        MPI_Comm_size(local_comm, &n_local_procs);

        int my_rank;
        MPI_Comm_rank(local_comm, &my_rank);

        // Free the local communicator.
        MPI_Comm_free(&local_comm);

        // For each rank that shares a GPU, use round-robin assignment
        // to assign MPI ranks to GPUs. We will arbitrarily assign
        // ranks to GPUs, assuming that socket awareness has already
        // been handled.

        device_id = my_rank % gpu_device_count;

        // If we detect more ranks than visible GPUs, warn the user
        // that this will fail in the case where the devices are
        // set to exclusive process mode and MPS is not enabled.

        if (n_local_procs > gpu_device_count) {
            amrex::Print() << "Mapping more than one rank per GPU. This will fail if the GPUs are in exclusive process mode\n"
                           << "and MPS is not enabled. In that case you will see an error such as: 'all CUDA-capable devices are\n"
                           << "busy'. To resolve that issue, set the GPUs to the default compute mode, or enable MPS. If you are\n"
                           << "on a cluster, please consult the system user guide for how to launch your job in this configuration.\n";
        }

#endif   // BL_USE_MPI

    }

    AMREX_HIP_OR_CUDA(AMREX_HIP_SAFE_CALL (hipSetDevice(device_id));,
                      AMREX_CUDA_SAFE_CALL(cudaSetDevice(device_id)); );

#ifdef AMREX_USE_ACC
    amrex_initialize_acc(device_id);
#endif

    initialize_gpu();

#ifdef AMREX_USE_CUDA

    // Count up the total number of devices used by
    // all MPI ranks. Since we have to consider the
    // case of multiple ranks per GPU, we cannot simply
    // set it to the number of MPI ranks. A reliable way
    // to do this instead is to collect the UUID of each
    // GPU used by every rank, perform a gather, and then
    // count the number of unique UUIDs in the result.

    // Note: the field we need from the CUDA device properties
    // is only available starting from CUDA 10.0, so we will
    // leave num_devices_used as 0 for older CUDA toolkits.

    size_t uuid_length = 16;
    size_t recv_sz = uuid_length * ParallelDescriptor::NProcs();
    const char* sendbuf = &device_prop.uuid.bytes[0];
    char* recvbuf = new char[recv_sz];

    ParallelDescriptor::Gather<char,char>(sendbuf, uuid_length,
                                          recvbuf, uuid_length,
                                          ParallelDescriptor::IOProcessorNumber());

    if (ParallelDescriptor::IOProcessor()) {
        std::unordered_set<std::string> uuids;
        for (int i = 0; i < ParallelDescriptor::NProcs(); ++i) {
            std::string uuid(&recvbuf[16 * i], 16);
            if (uuids.find(uuid) == uuids.end()) {
                uuids.insert(uuid);
            }
        }
        num_devices_used = uuids.size();
    }
    ParallelDescriptor::Bcast<int>(&num_devices_used, 1);

    delete[] recvbuf;

#if (defined(AMREX_PROFILING) || defined(AMREX_TINY_PROFILING))
    nvtxRangePop();
#endif
    if (amrex::Verbose()) {
#if defined(AMREX_USE_MPI)
        if (num_devices_used == ParallelDescriptor::NProcs())
        {
            amrex::Print() << "CUDA initialized with 1 GPU per MPI rank; "
                           << num_devices_used << " GPU(s) used in total\n";
        }
        else
        {
            amrex::Print() << "CUDA initialized with " << num_devices_used << " GPU(s) and "
                           << ParallelDescriptor::NProcs() << " ranks.\n";
        }
#else
        amrex::Print() << "CUDA initialized with 1 GPU\n";
#endif // AMREX_USE_MPI
    }

#elif defined(AMREX_USE_HIP)
    if (amrex::Verbose()) {
        if (ParallelDescriptor::NProcs() > 1) {
#ifdef BL_USE_MPI
            amrex::Print() << "HIP initialized.  On the first node/socket, there are "
                           << n_local_procs << " processes and " << gpu_device_count << " GPUs\n";
#endif
        } else {
            amrex::Print() << "HIP initialized.\n";
        }
    }
#elif defined(AMREX_USE_DPCPP)
    if (amrex::Verbose()) {
        amrex::Print() << "oneAPI initialized.\n";
    }
#endif

    Device::profilerStart();

}